

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O3

void __thiscall
zmq::socket_base_t::inprocs_t::emplace(inprocs_t *this,char *endpoint_uri_,pipe_t *pipe_)

{
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  pipe_t *local_20;
  
  local_20 = pipe_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,endpoint_uri_,&local_41);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,zmq::pipe_t*>,std::_Select1st<std::pair<std::__cxx11::string_const,zmq::pipe_t*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zmq::pipe_t*>>>
  ::_M_emplace_equal<std::__cxx11::string,zmq::pipe_t*&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,zmq::pipe_t*>,std::_Select1st<std::pair<std::__cxx11::string_const,zmq::pipe_t*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zmq::pipe_t*>>>
              *)this,&local_40,&local_20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void zmq::socket_base_t::inprocs_t::emplace (const char *endpoint_uri_,
                                             pipe_t *pipe_)
{
    _inprocs.ZMQ_MAP_INSERT_OR_EMPLACE (std::string (endpoint_uri_), pipe_);
}